

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::swap(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
       *this,robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
             *other)

{
  float fVar1;
  bool bVar2;
  size_t sVar3;
  bucket_entry *pbVar4;
  size_type sVar5;
  
  sVar3 = (this->super_power_of_two_growth_policy<2UL>).m_mask;
  (this->super_power_of_two_growth_policy<2UL>).m_mask =
       (other->super_power_of_two_growth_policy<2UL>).m_mask;
  (other->super_power_of_two_growth_policy<2UL>).m_mask = sVar3;
  std::
  _Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
  ::_Vector_impl_data::_M_swap_data
            ((_Vector_impl_data *)&this->m_buckets_data,(_Vector_impl_data *)&other->m_buckets_data)
  ;
  pbVar4 = this->m_buckets;
  this->m_buckets = other->m_buckets;
  other->m_buckets = pbVar4;
  sVar5 = this->m_bucket_count;
  this->m_bucket_count = other->m_bucket_count;
  other->m_bucket_count = sVar5;
  sVar5 = this->m_nb_elements;
  this->m_nb_elements = other->m_nb_elements;
  other->m_nb_elements = sVar5;
  sVar5 = this->m_load_threshold;
  this->m_load_threshold = other->m_load_threshold;
  other->m_load_threshold = sVar5;
  fVar1 = this->m_min_load_factor;
  this->m_min_load_factor = other->m_min_load_factor;
  other->m_min_load_factor = fVar1;
  fVar1 = this->m_max_load_factor;
  this->m_max_load_factor = other->m_max_load_factor;
  other->m_max_load_factor = fVar1;
  bVar2 = this->m_grow_on_next_insert;
  this->m_grow_on_next_insert = other->m_grow_on_next_insert;
  other->m_grow_on_next_insert = bVar2;
  bVar2 = this->m_try_shrink_on_next_insert;
  this->m_try_shrink_on_next_insert = other->m_try_shrink_on_next_insert;
  other->m_try_shrink_on_next_insert = bVar2;
  return;
}

Assistant:

void swap(robin_hash& other) {
    using std::swap;

    swap(static_cast<Hash&>(*this), static_cast<Hash&>(other));
    swap(static_cast<KeyEqual&>(*this), static_cast<KeyEqual&>(other));
    swap(static_cast<GrowthPolicy&>(*this), static_cast<GrowthPolicy&>(other));
    swap(m_buckets_data, other.m_buckets_data);
    swap(m_buckets, other.m_buckets);
    swap(m_bucket_count, other.m_bucket_count);
    swap(m_nb_elements, other.m_nb_elements);
    swap(m_load_threshold, other.m_load_threshold);
    swap(m_min_load_factor, other.m_min_load_factor);
    swap(m_max_load_factor, other.m_max_load_factor);
    swap(m_grow_on_next_insert, other.m_grow_on_next_insert);
    swap(m_try_shrink_on_next_insert, other.m_try_shrink_on_next_insert);
  }